

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

GeometricObject * __thiscall Scene::intersect(Scene *this,Ray *r,double *t)

{
  double dVar1;
  long *plVar2;
  char cVar3;
  pointer psVar4;
  ulong uVar5;
  long lVar6;
  shared_ptr<GeometricObject> closest_obj;
  double local_50;
  GeometricObject *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  local_48 = (GeometricObject *)0x0;
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  psVar4 = (this->solid).
           super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->solid).
      super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == psVar4) {
    local_50 = 30000.0;
  }
  else {
    local_50 = 30000.0;
    lVar6 = 8;
    uVar5 = 0;
    do {
      plVar2 = *(long **)((long)psVar4 + lVar6 + -8);
      cVar3 = (**(code **)(*plVar2 + 0x10))(plVar2,r,t);
      if ((cVar3 != '\0') && (dVar1 = *t, dVar1 < local_50)) {
        psVar4 = (this->solid).
                 super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_48 = *(GeometricObject **)((long)psVar4 + lVar6 + -8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (a_Stack_40,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(psVar4->super___shared_ptr<GeometricObject,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr + lVar6));
        local_50 = dVar1;
      }
      uVar5 = uVar5 + 1;
      psVar4 = (this->solid).
               super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x10;
    } while (uVar5 < (ulong)((long)(this->solid).
                                   super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4));
  }
  *t = local_50;
  if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
  }
  return local_48;
}

Assistant:

GeometricObject *Scene::intersect(Ray& r, double& t)
{
    std::shared_ptr<GeometricObject> closest_obj;
    double           closest_dist = GEOM_INFINITY;

    for(int i = 0; i < solid.size(); ++i)
        if( solid[i]->intersect(r,t) )
            if( t < closest_dist )
            {
                closest_dist = t;
                closest_obj = solid[i];
            }
    t = closest_dist;
    return closest_obj.get();
}